

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::UnitTest::set_current_test_suite(UnitTest *this,TestSuite *a_current_test_suite)

{
  GTestMutexLock local_20;
  MutexLock lock;
  TestSuite *a_current_test_suite_local;
  UnitTest *this_local;
  
  lock.mutex_ = (MutexBase *)a_current_test_suite;
  internal::GTestMutexLock::GTestMutexLock(&local_20,&(this->mutex_).super_MutexBase);
  internal::UnitTestImpl::set_current_test_suite(this->impl_,(TestSuite *)lock.mutex_);
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return;
}

Assistant:

void UnitTest::set_current_test_suite(TestSuite* a_current_test_suite) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_suite(a_current_test_suite);
}